

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

int google::protobuf::compiler::ruby::GeneratePackageModules(string *package_name,Printer *printer)

{
  byte bVar1;
  string local_b8;
  string local_98 [32];
  string local_78 [48];
  undefined1 local_48 [8];
  string component;
  size_t dot_index;
  int levels;
  Printer *printer_local;
  string *package_name_local;
  
  dot_index._4_4_ = 0;
  while( true ) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    component.field_2._8_8_ = std::__cxx11::string::find((char *)package_name,0x5dcadc);
    std::__cxx11::string::string((string *)local_48);
    if (component.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=((string *)local_48,(string *)package_name);
      std::__cxx11::string::operator=((string *)package_name,"");
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)package_name);
      std::__cxx11::string::operator=((string *)local_48,local_78);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::substr((ulong)local_98,(ulong)package_name);
      std::__cxx11::string::operator=((string *)package_name,local_98);
      std::__cxx11::string::~string(local_98);
    }
    PackageToModule(&local_b8,(string *)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    io::Printer::Print(printer,"module $name$\n","name",(string *)local_48);
    io::Printer::Indent(printer);
    dot_index._4_4_ = dot_index._4_4_ + 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  return dot_index._4_4_;
}

Assistant:

int GeneratePackageModules(
    std::string package_name,
    google::protobuf::io::Printer* printer) {
  int levels = 0;
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(".");
    string component;
    if (dot_index == string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + 1);
    }
    component = PackageToModule(component);
    printer->Print(
      "module $name$\n",
      "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}